

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

int stbi_is_16_bit_from_callbacks(stbi_io_callbacks *c,void *user)

{
  stbi_uc *psVar1;
  int iVar2;
  stbi__context s;
  stbi__context local_e0;
  
  local_e0.io.eof = c->eof;
  psVar1 = local_e0.buffer_start;
  local_e0.io.read._0_4_ = *(undefined4 *)&c->read;
  local_e0.io.read._4_4_ = *(undefined4 *)((long)&c->read + 4);
  local_e0.io.skip._0_4_ = *(undefined4 *)&c->skip;
  local_e0.io.skip._4_4_ = *(undefined4 *)((long)&c->skip + 4);
  local_e0.read_from_callbacks = 1;
  local_e0.buflen = 0x80;
  local_e0.io_user_data = user;
  local_e0.img_buffer_original = psVar1;
  iVar2 = (*c->read)(user,(char *)psVar1,0x80);
  if (iVar2 == 0) {
    local_e0.img_buffer_end = local_e0.buffer_start + 1;
    local_e0._48_8_ = local_e0._48_8_ & 0xffffffff00000000;
    local_e0.buffer_start[0] = '\0';
  }
  else {
    local_e0.img_buffer_end = psVar1 + iVar2;
  }
  local_e0.img_buffer = psVar1;
  local_e0.img_buffer_original_end = local_e0.img_buffer_end;
  iVar2 = stbi__is_16_main(&local_e0);
  return iVar2;
}

Assistant:

static void stbi__start_callbacks(stbi__context *s, stbi_io_callbacks *c, void *user)
{
   s->io = *c;
   s->io_user_data = user;
   s->buflen = sizeof(s->buffer_start);
   s->read_from_callbacks = 1;
   s->img_buffer_original = s->buffer_start;
   stbi__refill_buffer(s);
   s->img_buffer_original_end = s->img_buffer_end;
}